

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_NodeIntersectLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  void **__ptr;
  void **ppvVar5;
  void **ppvVar6;
  int iVar7;
  void **ppvVar8;
  void **ppvVar9;
  
  ppvVar8 = vArr1->pArray;
  iVar4 = vArr1->nSize;
  iVar1 = vArr2->nSize;
  iVar3 = iVar1;
  if (iVar1 < iVar4) {
    iVar3 = iVar4;
  }
  ppvVar9 = vArr2->pArray;
  iVar7 = vArr->nCap;
  __ptr = vArr->pArray;
  if (iVar7 < iVar3) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc((long)iVar3 << 3);
    }
    else {
      __ptr = (void **)realloc(__ptr,(long)iVar3 << 3);
    }
    vArr->pArray = __ptr;
    vArr->nCap = iVar3;
    iVar7 = iVar3;
  }
  ppvVar5 = __ptr;
  if (0 < iVar1 && 0 < iVar4) {
    ppvVar5 = ppvVar8 + iVar4;
    ppvVar6 = ppvVar9 + iVar1;
    do {
      pvVar2 = *ppvVar8;
      iVar4 = *(int *)((long)pvVar2 + 0x24);
      if (iVar4 == *(int *)((long)*ppvVar9 + 0x24)) {
        ppvVar8 = ppvVar8 + 1;
        *__ptr = pvVar2;
        __ptr = __ptr + 1;
LAB_006d8b1f:
        ppvVar9 = ppvVar9 + 1;
      }
      else {
        if (*(int *)((long)*ppvVar9 + 0x24) <= iVar4) goto LAB_006d8b1f;
        ppvVar8 = ppvVar8 + 1;
      }
    } while ((ppvVar8 < ppvVar5) && (ppvVar9 < ppvVar6));
    ppvVar5 = vArr->pArray;
  }
  iVar4 = (int)((ulong)((long)__ptr - (long)ppvVar5) >> 3);
  vArr->nSize = iVar4;
  if (iVar7 < iVar4) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x511,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vArr1->nSize < iVar4) {
    __assert_fail("vArr->nSize <= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x512,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vArr2->nSize < iVar4) {
    __assert_fail("vArr->nSize <= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x513,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Aig_NodeIntersectLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Abc_MaxInt( Vec_PtrSize(vArr1), Vec_PtrSize(vArr2) ) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
//            *pBeg++ = *pBeg1++;
            pBeg1++;
        else 
//            *pBeg++ = *pBeg2++;
            pBeg2++;
    }
//    while ( pBeg1 < pEnd1 )
//        *pBeg++ = *pBeg1++;
//    while ( pBeg2 < pEnd2 )
//        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize <= vArr1->nSize );
    assert( vArr->nSize <= vArr2->nSize );
}